

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O1

void __thiscall
agge::tests::VectorRasterizerTests::NegativeInterCellsVerticalLinesProduceNegativeCover
          (VectorRasterizerTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cell reference2 [2];
  vector_rasterizer vr;
  cell reference3 [3];
  cell reference1 [6];
  string local_150;
  LocationInfo local_130;
  undefined1 local_108 [8];
  undefined1 auStack_100 [16];
  vector_rasterizer local_f0;
  undefined1 local_78 [8];
  undefined1 auStack_70 [8];
  undefined1 auStack_68 [16];
  undefined1 local_58 [8];
  undefined1 auStack_50 [8];
  undefined1 local_48 [8];
  undefined1 auStack_40 [16];
  undefined1 auStack_30 [8];
  undefined1 auStack_28 [16];
  
  vector_rasterizer::vector_rasterizer(&local_f0);
  vector_rasterizer::line(&local_f0,0x300,0xa1a,0x300,0x500);
  auStack_28._0_2_ = -0x100;
  auStack_28._2_2_ = 3;
  auStack_28._4_2_ = 5;
  auStack_28._6_4_ = 0;
  auStack_28._10_2_ = -0x100;
  auStack_40._8_2_ = 7;
  auStack_40._10_4_ = 0;
  auStack_40._14_2_ = -0x100;
  auStack_30._0_2_ = 3;
  auStack_30._2_2_ = 6;
  auStack_30._4_4_ = 0;
  local_48 = (undefined1  [8])0x80003ff000000;
  auStack_40._0_4_ = 0;
  auStack_40._4_2_ = -0x100;
  auStack_40._6_2_ = 3;
  local_58._0_2_ = 3;
  local_58._2_2_ = 10;
  local_58._4_4_ = 0;
  auStack_50._0_2_ = -0x1a;
  auStack_50._2_2_ = 3;
  auStack_50._4_4_ = 9;
  paVar1 = &local_150.field_2;
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_130,&local_150,0x14c);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,6ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [6])local_58,&local_f0._cells,&local_130);
  paVar2 = &local_130.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_130.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  vector_rasterizer::reset(&local_f0);
  vector_rasterizer::line(&local_f0,0x1700,0x1300,0x1700,0x1100);
  local_108._0_2_ = 0x17;
  local_108._2_2_ = 0x12;
  local_108._4_4_ = 0;
  auStack_100._0_2_ = -0x100;
  auStack_100._2_2_ = 0x17;
  auStack_100._4_4_ = 0x11;
  auStack_100._8_4_ = 0xff000000;
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_130,&local_150,0x15a);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,2ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [2])local_108,&local_f0._cells,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_130.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  vector_rasterizer::reset(&local_f0);
  vector_rasterizer::line(&local_f0,-0x753100,-0x2cd,-0x753100,-0x4b6);
  auStack_68._0_6_ = 0x8acfff000000;
  auStack_68._6_2_ = -5;
  auStack_68._8_4_ = 0;
  auStack_68._12_2_ = -0xb6;
  local_78._0_2_ = -0x7531;
  local_78._2_2_ = -3;
  local_78._4_4_ = 0;
  auStack_70._0_2_ = -0x33;
  auStack_70._2_2_ = -0x7531;
  auStack_70._4_2_ = -4;
  auStack_70._6_2_ = 0;
  local_150._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_130,&local_150,0x169);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,3ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [3])local_78,&local_f0._cells,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_130.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if (local_f0._x_sorted_cells._begin != (cell *)0x0) {
    operator_delete__(local_f0._x_sorted_cells._begin);
  }
  if (local_f0._histogram_x._begin != (uint *)0x0) {
    operator_delete__(local_f0._histogram_x._begin);
  }
  if (local_f0._histogram_y._begin != (uint *)0x0) {
    operator_delete__(local_f0._histogram_y._begin);
  }
  if (local_f0._cells._begin != (cell *)0x0) {
    operator_delete__(local_f0._cells._begin);
  }
  return;
}

Assistant:

test( NegativeInterCellsVerticalLinesProduceNegativeCover )
			{
				// INIT
				vector_rasterizer vr;

				// ACT
				vr.line(fp(3.0), fp(10.1), fp(3.0), fp(5.0));

				// ASSERT
				const vector_rasterizer::cell reference1[] = {
					{ 3, 10, 0, -26 },
					{ 3, 9, 0, -256 },
					{ 3, 8, 0, -256 },
					{ 3, 7, 0, -256 },
					{ 3, 6, 0, -256 },
					{ 3, 5, 0, -256 },
				};

				assert_equal(reference1, vr.cells());

				// INIT
				vr.reset();

				// ACT
				vr.line(fp(23.0), fp(19.0), fp(23.0), fp(17.0));

				// ASSERT
				const vector_rasterizer::cell reference2[] = {
					{ 23, 18, 0, -256 },
					{ 23, 17, 0, -256 },
				};

				assert_equal(reference2, vr.cells());

				// INIT
				vr.reset();

				// ACT
				vr.line(fp(-30001.0), fp(-2.8), fp(-30001.0), fp(-4.71));

				// ASSERT
				const vector_rasterizer::cell reference3[] = {
					{ -30001, -3, 0, -51 },
					{ -30001, -4, 0, -256 },
					{ -30001, -5, 0, -182 },
				};

				assert_equal(reference3, vr.cells());
			}